

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test::
~TEST_TestRegistry_listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
          (TEST_TestRegistry_listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
           *this)

{
  TEST_TestRegistry_listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
  *this_local;
  
  ~TEST_TestRegistry_listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
            (this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST(TestRegistry, listTestGroupAndCaseNames_shouldListBackwardsGroupATestaAfterGroupAtestaa)
{
    test1->setGroupName("GROUP_A");
    test1->setTestName("test_a");
    myRegistry->addTest(test1);
    test2->setGroupName("GROUP_B");
    test2->setTestName("test_b");
    myRegistry->addTest(test2);
    test3->setGroupName("GROUP_A");
    test3->setTestName("test_aa");
    myRegistry->addTest(test3);

    myRegistry->listTestGroupAndCaseNames(*result);
    SimpleString s = output->getOutput();
    STRCMP_EQUAL("GROUP_A.test_aa GROUP_B.test_b GROUP_A.test_a", s.asCharString());
}